

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::setupSpherical
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool disableParentCollision)

{
  int *piVar1;
  btVector3 *pbVar2;
  btQuaternion *pbVar3;
  btSpatialMotionVector *this_00;
  btScalar *pbVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  btMultibodyLink *pbVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  btVector3 bVar10;
  
  uVar5 = this->m_dofCount;
  uVar6 = this->m_posVarCnt;
  this->m_dofCount = uVar5 + 3;
  this->m_posVarCnt = uVar6 + 4;
  pbVar7 = (this->m_links).m_data;
  pbVar7[i].m_mass = mass;
  uVar8 = *(undefined8 *)(inertia->m_floats + 2);
  pbVar2 = &pbVar7[i].m_inertiaLocal;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar8;
  pbVar7 = (this->m_links).m_data;
  pbVar7[i].m_parent = parent;
  uVar8 = *(undefined8 *)((rotParentToThis->super_btQuadWord).m_floats + 2);
  pbVar3 = &pbVar7[i].m_zeroRotParentToThis;
  *(undefined8 *)(pbVar3->super_btQuadWord).m_floats =
       *(undefined8 *)(rotParentToThis->super_btQuadWord).m_floats;
  *(undefined8 *)((pbVar3->super_btQuadWord).m_floats + 2) = uVar8;
  uVar8 = *(undefined8 *)(thisPivotToThisComOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_dVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)thisPivotToThisComOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar8;
  uVar8 = *(undefined8 *)(parentComToThisPivotOffset->m_floats + 2);
  pbVar2 = &(this->m_links).m_data[i].m_eVector;
  *(undefined8 *)pbVar2->m_floats = *(undefined8 *)parentComToThisPivotOffset->m_floats;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar8;
  this_00 = (this->m_links).m_data[i].m_axes;
  *(eFeatherstoneJointType *)((long)(this_00 + 0xb) + 0x14) = eSpherical;
  *(undefined8 *)((long)(this_00 + 0xb) + 0xc) = 0x400000003;
  auVar9._0_12_ = ZEXT812(0x3f800000);
  auVar9._12_4_ = 0;
  *(undefined1 (*) [16])(this_00->m_topVec).m_floats = auVar9;
  this_00[1].m_topVec.m_floats[0] = 0.0;
  this_00[1].m_topVec.m_floats[1] = 1.0;
  this_00[1].m_topVec.m_floats[2] = 0.0;
  this_00[1].m_topVec.m_floats[3] = 0.0;
  this_00[2].m_topVec.m_floats[0] = 0.0;
  this_00[2].m_topVec.m_floats[1] = 0.0;
  this_00[2].m_topVec.m_floats[2] = 1.0;
  this_00[2].m_topVec.m_floats[3] = 0.0;
  bVar10 = btVector3::cross(&this_00->m_topVec,thisPivotToThisComOffset);
  *&(this_00->m_bottomVec).m_floats = bVar10.m_floats;
  pbVar7 = (this->m_links).m_data;
  bVar10 = btVector3::cross(&pbVar7[i].m_axes[1].m_topVec,thisPivotToThisComOffset);
  *&pbVar7[i].m_axes[1].m_bottomVec.m_floats = bVar10.m_floats;
  pbVar7 = (this->m_links).m_data;
  bVar10 = btVector3::cross(&pbVar7[i].m_axes[2].m_topVec,thisPivotToThisComOffset);
  *&pbVar7[i].m_axes[2].m_bottomVec.m_floats = bVar10.m_floats;
  pbVar7 = (this->m_links).m_data;
  pbVar4 = pbVar7[i].m_jointPos;
  pbVar4[0] = 0.0;
  pbVar4[1] = 0.0;
  pbVar4[2] = 0.0;
  pbVar4[3] = 1.0;
  pbVar7[i].m_jointTorque[2] = 0.0;
  pbVar7[i].m_jointTorque[0] = 0.0;
  pbVar7[i].m_jointTorque[1] = 0.0;
  if (disableParentCollision) {
    piVar1 = &pbVar7[i].m_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  btMultibodyLink::updateCacheMultiDof(pbVar7 + i,(btScalar *)0x0);
  updateLinksDofOffsets(this);
  return;
}

Assistant:

void btMultiBody::setupSpherical(int i,
						   btScalar mass,
						   const btVector3 &inertia,
						   int parent,
						   const btQuaternion &rotParentToThis,
						   const btVector3 &parentComToThisPivotOffset,
						   const btVector3 &thisPivotToThisComOffset,
						   bool disableParentCollision)
{
	
	m_dofCount += 3;
	m_posVarCnt += 4;

	m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;    
    m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;    

	m_links[i].m_jointType = btMultibodyLink::eSpherical;
	m_links[i].m_dofCount = 3;
	m_links[i].m_posVarCount = 4;
	m_links[i].setAxisTop(0, 1.f, 0.f, 0.f);
	m_links[i].setAxisTop(1, 0.f, 1.f, 0.f);
	m_links[i].setAxisTop(2, 0.f, 0.f, 1.f);
	m_links[i].setAxisBottom(0, m_links[i].getAxisTop(0).cross(thisPivotToThisComOffset));
	m_links[i].setAxisBottom(1, m_links[i].getAxisTop(1).cross(thisPivotToThisComOffset));
	m_links[i].setAxisBottom(2, m_links[i].getAxisTop(2).cross(thisPivotToThisComOffset));
	m_links[i].m_jointPos[0] = m_links[i].m_jointPos[1] = m_links[i].m_jointPos[2] = 0.f; m_links[i].m_jointPos[3] = 1.f;
	m_links[i].m_jointTorque[0] = m_links[i].m_jointTorque[1] = m_links[i].m_jointTorque[2] = 0.f;


	if (disableParentCollision)
		m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;    
	//
	m_links[i].updateCacheMultiDof();	
	//
	updateLinksDofOffsets();
}